

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_loadfile(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  char *filename;
  int iVar3;
  
  iVar3 = 1;
  filename = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  iVar2 = luaL_loadfile(L,filename);
  if (iVar2 != 0) {
    pTVar1 = L->top;
    pTVar1->tt = 0;
    L->top = pTVar1 + 1;
    lua_insert(L,-2);
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static int luaB_loadfile(lua_State*L){
const char*fname=luaL_optstring(L,1,NULL);
return load_aux(L,luaL_loadfile(L,fname));
}